

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
::raw_hash_set(raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
               *this,raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                     *that,allocator_type *a)

{
  slot_type *psVar1;
  long lVar2;
  char cVar3;
  char *pcVar4;
  size_t sVar5;
  pointer pcVar6;
  uint uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  undefined1 auVar17 [11];
  undefined1 auVar18 [11];
  undefined1 auVar19 [12];
  undefined1 auVar20 [12];
  undefined1 auVar21 [13];
  undefined1 auVar22 [13];
  undefined1 auVar23 [14];
  undefined1 auVar24 [14];
  size_t sVar25;
  uint uVar26;
  size_t hashval;
  char *pcVar27;
  value_type *v;
  slot_type *__s;
  char in_XMM1_Ba;
  char in_XMM1_Bb;
  char in_XMM1_Bc;
  char in_XMM1_Bd;
  char in_XMM1_Be;
  char in_XMM1_Bf;
  char in_XMM1_Bg;
  char in_XMM1_Bh;
  char in_XMM1_Bi;
  char in_XMM1_Bj;
  char in_XMM1_Bk;
  char in_XMM1_Bl;
  char in_XMM1_Bm;
  char in_XMM1_Bn;
  char in_XMM1_Bo;
  byte in_XMM1_Bp;
  FindInfo FVar28;
  hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_41;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *local_40;
  slot_type **local_38;
  
  this->ctrl_ = EmptyGroup()::empty_group;
  (this->settings_).
  super_CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
  .
  super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>,_0UL,_false>
  .value = 0;
  this->slots_ = (slot_type *)0x0;
  this->size_ = 0;
  this->capacity_ = 0;
  rehash(this,that->capacity_);
  pcVar4 = that->ctrl_;
  __s = that->slots_;
  cVar3 = *pcVar4;
  pcVar27 = pcVar4;
  while (cVar3 < -1) {
    iVar13 = -(uint)(CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))) ==
                    CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))));
    iVar14 = -(uint)(CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))) ==
                    CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))));
    iVar15 = -(uint)(CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))) ==
                    CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))));
    iVar16 = -(uint)(CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))) ==
                    CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))));
    in_XMM1_Ba = -(*pcVar27 < (char)iVar13);
    in_XMM1_Bb = -(pcVar27[1] < (char)((uint)iVar13 >> 8));
    in_XMM1_Bc = -(pcVar27[2] < (char)((uint)iVar13 >> 0x10));
    in_XMM1_Bd = -(pcVar27[3] < (char)((uint)iVar13 >> 0x18));
    in_XMM1_Be = -(pcVar27[4] < (char)iVar14);
    in_XMM1_Bf = -(pcVar27[5] < (char)((uint)iVar14 >> 8));
    in_XMM1_Bg = -(pcVar27[6] < (char)((uint)iVar14 >> 0x10));
    in_XMM1_Bh = -(pcVar27[7] < (char)((uint)iVar14 >> 0x18));
    in_XMM1_Bi = -(pcVar27[8] < (char)iVar15);
    in_XMM1_Bj = -(pcVar27[9] < (char)((uint)iVar15 >> 8));
    in_XMM1_Bk = -(pcVar27[10] < (char)((uint)iVar15 >> 0x10));
    in_XMM1_Bl = -(pcVar27[0xb] < (char)((uint)iVar15 >> 0x18));
    in_XMM1_Bm = -(pcVar27[0xc] < (char)iVar16);
    in_XMM1_Bn = -(pcVar27[0xd] < (char)((uint)iVar16 >> 8));
    in_XMM1_Bo = -(pcVar27[0xe] < (char)((uint)iVar16 >> 0x10));
    in_XMM1_Bp = -(pcVar27[0xf] < (char)((uint)iVar16 >> 0x18));
    auVar9[1] = in_XMM1_Bb;
    auVar9[0] = in_XMM1_Ba;
    auVar9[2] = in_XMM1_Bc;
    auVar9[3] = in_XMM1_Bd;
    auVar9[4] = in_XMM1_Be;
    auVar9[5] = in_XMM1_Bf;
    auVar9[6] = in_XMM1_Bg;
    auVar9[7] = in_XMM1_Bh;
    auVar9[8] = in_XMM1_Bi;
    auVar9[9] = in_XMM1_Bj;
    auVar9[10] = in_XMM1_Bk;
    auVar9[0xb] = in_XMM1_Bl;
    auVar9[0xc] = in_XMM1_Bm;
    auVar9[0xd] = in_XMM1_Bn;
    auVar9[0xe] = in_XMM1_Bo;
    auVar9[0xf] = in_XMM1_Bp;
    auVar10[1] = in_XMM1_Bb;
    auVar10[0] = in_XMM1_Ba;
    auVar10[2] = in_XMM1_Bc;
    auVar10[3] = in_XMM1_Bd;
    auVar10[4] = in_XMM1_Be;
    auVar10[5] = in_XMM1_Bf;
    auVar10[6] = in_XMM1_Bg;
    auVar10[7] = in_XMM1_Bh;
    auVar10[8] = in_XMM1_Bi;
    auVar10[9] = in_XMM1_Bj;
    auVar10[10] = in_XMM1_Bk;
    auVar10[0xb] = in_XMM1_Bl;
    auVar10[0xc] = in_XMM1_Bm;
    auVar10[0xd] = in_XMM1_Bn;
    auVar10[0xe] = in_XMM1_Bo;
    auVar10[0xf] = in_XMM1_Bp;
    auVar23[1] = in_XMM1_Bd;
    auVar23[0] = in_XMM1_Bc;
    auVar23[2] = in_XMM1_Be;
    auVar23[3] = in_XMM1_Bf;
    auVar23[4] = in_XMM1_Bg;
    auVar23[5] = in_XMM1_Bh;
    auVar23[6] = in_XMM1_Bi;
    auVar23[7] = in_XMM1_Bj;
    auVar23[8] = in_XMM1_Bk;
    auVar23[9] = in_XMM1_Bl;
    auVar23[10] = in_XMM1_Bm;
    auVar23[0xb] = in_XMM1_Bn;
    auVar23[0xc] = in_XMM1_Bo;
    auVar23[0xd] = in_XMM1_Bp;
    auVar21[1] = in_XMM1_Be;
    auVar21[0] = in_XMM1_Bd;
    auVar21[2] = in_XMM1_Bf;
    auVar21[3] = in_XMM1_Bg;
    auVar21[4] = in_XMM1_Bh;
    auVar21[5] = in_XMM1_Bi;
    auVar21[6] = in_XMM1_Bj;
    auVar21[7] = in_XMM1_Bk;
    auVar21[8] = in_XMM1_Bl;
    auVar21[9] = in_XMM1_Bm;
    auVar21[10] = in_XMM1_Bn;
    auVar21[0xb] = in_XMM1_Bo;
    auVar21[0xc] = in_XMM1_Bp;
    auVar19[1] = in_XMM1_Bf;
    auVar19[0] = in_XMM1_Be;
    auVar19[2] = in_XMM1_Bg;
    auVar19[3] = in_XMM1_Bh;
    auVar19[4] = in_XMM1_Bi;
    auVar19[5] = in_XMM1_Bj;
    auVar19[6] = in_XMM1_Bk;
    auVar19[7] = in_XMM1_Bl;
    auVar19[8] = in_XMM1_Bm;
    auVar19[9] = in_XMM1_Bn;
    auVar19[10] = in_XMM1_Bo;
    auVar19[0xb] = in_XMM1_Bp;
    auVar17[1] = in_XMM1_Bg;
    auVar17[0] = in_XMM1_Bf;
    auVar17[2] = in_XMM1_Bh;
    auVar17[3] = in_XMM1_Bi;
    auVar17[4] = in_XMM1_Bj;
    auVar17[5] = in_XMM1_Bk;
    auVar17[6] = in_XMM1_Bl;
    auVar17[7] = in_XMM1_Bm;
    auVar17[8] = in_XMM1_Bn;
    auVar17[9] = in_XMM1_Bo;
    auVar17[10] = in_XMM1_Bp;
    uVar26 = (ushort)((ushort)(SUB161(auVar9 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB141(auVar23 >> 7,0) & 1) << 2 |
                      (ushort)(SUB131(auVar21 >> 7,0) & 1) << 3 |
                      (ushort)(SUB121(auVar19 >> 7,0) & 1) << 4 |
                      (ushort)(SUB111(auVar17 >> 7,0) & 1) << 5 |
                      (ushort)((byte)(CONCAT19(in_XMM1_Bp,
                                               CONCAT18(in_XMM1_Bo,
                                                        CONCAT17(in_XMM1_Bn,
                                                                 CONCAT16(in_XMM1_Bm,
                                                                          CONCAT15(in_XMM1_Bl,
                                                                                   CONCAT14(
                                                  in_XMM1_Bk,
                                                  CONCAT13(in_XMM1_Bj,
                                                           CONCAT12(in_XMM1_Bi,
                                                                    CONCAT11(in_XMM1_Bh,in_XMM1_Bg))
                                                          ))))))) >> 7) & 1) << 6 |
                      (ushort)((byte)(CONCAT18(in_XMM1_Bp,
                                               CONCAT17(in_XMM1_Bo,
                                                        CONCAT16(in_XMM1_Bn,
                                                                 CONCAT15(in_XMM1_Bm,
                                                                          CONCAT14(in_XMM1_Bl,
                                                                                   CONCAT13(
                                                  in_XMM1_Bk,
                                                  CONCAT12(in_XMM1_Bj,
                                                           CONCAT11(in_XMM1_Bi,in_XMM1_Bh)))))))) >>
                                     7) & 1) << 7 | (ushort)(in_XMM1_Bp >> 7) << 0xf) + 1;
    uVar7 = 0;
    if (uVar26 != 0) {
      for (; (uVar26 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
      }
    }
    __s = __s + uVar7;
    cVar3 = pcVar27[uVar7];
    pcVar27 = pcVar27 + uVar7;
  }
  sVar5 = that->capacity_;
  local_40 = that;
  if (pcVar27 != pcVar4 + sVar5) {
    local_38 = &this->slots_;
    do {
      sVar25 = std::
               hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator()(&local_41,&(__s->value).first);
      auVar8._8_8_ = 0;
      auVar8._0_8_ = sVar25;
      hashval = SUB168(auVar8 * ZEXT816(0xde5fb9d2630458e9),8) +
                SUB168(auVar8 * ZEXT816(0xde5fb9d2630458e9),0);
      FVar28 = find_first_non_full(this,hashval);
      sVar25 = FVar28.offset;
      set_ctrl(this,sVar25,(byte)hashval & 0x7f);
      psVar1 = *local_38 + sVar25;
      lVar2 = (long)*local_38 + sVar25 * 0x28 + 0x10;
      *(long *)(lVar2 + -0x10) = lVar2;
      pcVar6 = (__s->value).first._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)psVar1,pcVar6,pcVar6 + (__s->key)._M_string_length);
      (psVar1->value).second = (__s->value).second;
      __s = __s + 1;
      cVar3 = pcVar27[1];
      pcVar27 = pcVar27 + 1;
      while (cVar3 < -1) {
        iVar13 = -(uint)(CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba)))
                        == CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba)))
                        );
        iVar14 = -(uint)(CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be)))
                        == CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be)))
                        );
        iVar15 = -(uint)(CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi)))
                        == CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi)))
                        );
        iVar16 = -(uint)(CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm)))
                        == CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm)))
                        );
        in_XMM1_Ba = -(*pcVar27 < (char)iVar13);
        in_XMM1_Bb = -(pcVar27[1] < (char)((uint)iVar13 >> 8));
        in_XMM1_Bc = -(pcVar27[2] < (char)((uint)iVar13 >> 0x10));
        in_XMM1_Bd = -(pcVar27[3] < (char)((uint)iVar13 >> 0x18));
        in_XMM1_Be = -(pcVar27[4] < (char)iVar14);
        in_XMM1_Bf = -(pcVar27[5] < (char)((uint)iVar14 >> 8));
        in_XMM1_Bg = -(pcVar27[6] < (char)((uint)iVar14 >> 0x10));
        in_XMM1_Bh = -(pcVar27[7] < (char)((uint)iVar14 >> 0x18));
        in_XMM1_Bi = -(pcVar27[8] < (char)iVar15);
        in_XMM1_Bj = -(pcVar27[9] < (char)((uint)iVar15 >> 8));
        in_XMM1_Bk = -(pcVar27[10] < (char)((uint)iVar15 >> 0x10));
        in_XMM1_Bl = -(pcVar27[0xb] < (char)((uint)iVar15 >> 0x18));
        in_XMM1_Bm = -(pcVar27[0xc] < (char)iVar16);
        in_XMM1_Bn = -(pcVar27[0xd] < (char)((uint)iVar16 >> 8));
        in_XMM1_Bo = -(pcVar27[0xe] < (char)((uint)iVar16 >> 0x10));
        in_XMM1_Bp = -(pcVar27[0xf] < (char)((uint)iVar16 >> 0x18));
        auVar11[1] = in_XMM1_Bb;
        auVar11[0] = in_XMM1_Ba;
        auVar11[2] = in_XMM1_Bc;
        auVar11[3] = in_XMM1_Bd;
        auVar11[4] = in_XMM1_Be;
        auVar11[5] = in_XMM1_Bf;
        auVar11[6] = in_XMM1_Bg;
        auVar11[7] = in_XMM1_Bh;
        auVar11[8] = in_XMM1_Bi;
        auVar11[9] = in_XMM1_Bj;
        auVar11[10] = in_XMM1_Bk;
        auVar11[0xb] = in_XMM1_Bl;
        auVar11[0xc] = in_XMM1_Bm;
        auVar11[0xd] = in_XMM1_Bn;
        auVar11[0xe] = in_XMM1_Bo;
        auVar11[0xf] = in_XMM1_Bp;
        auVar12[1] = in_XMM1_Bb;
        auVar12[0] = in_XMM1_Ba;
        auVar12[2] = in_XMM1_Bc;
        auVar12[3] = in_XMM1_Bd;
        auVar12[4] = in_XMM1_Be;
        auVar12[5] = in_XMM1_Bf;
        auVar12[6] = in_XMM1_Bg;
        auVar12[7] = in_XMM1_Bh;
        auVar12[8] = in_XMM1_Bi;
        auVar12[9] = in_XMM1_Bj;
        auVar12[10] = in_XMM1_Bk;
        auVar12[0xb] = in_XMM1_Bl;
        auVar12[0xc] = in_XMM1_Bm;
        auVar12[0xd] = in_XMM1_Bn;
        auVar12[0xe] = in_XMM1_Bo;
        auVar12[0xf] = in_XMM1_Bp;
        auVar24[1] = in_XMM1_Bd;
        auVar24[0] = in_XMM1_Bc;
        auVar24[2] = in_XMM1_Be;
        auVar24[3] = in_XMM1_Bf;
        auVar24[4] = in_XMM1_Bg;
        auVar24[5] = in_XMM1_Bh;
        auVar24[6] = in_XMM1_Bi;
        auVar24[7] = in_XMM1_Bj;
        auVar24[8] = in_XMM1_Bk;
        auVar24[9] = in_XMM1_Bl;
        auVar24[10] = in_XMM1_Bm;
        auVar24[0xb] = in_XMM1_Bn;
        auVar24[0xc] = in_XMM1_Bo;
        auVar24[0xd] = in_XMM1_Bp;
        auVar22[1] = in_XMM1_Be;
        auVar22[0] = in_XMM1_Bd;
        auVar22[2] = in_XMM1_Bf;
        auVar22[3] = in_XMM1_Bg;
        auVar22[4] = in_XMM1_Bh;
        auVar22[5] = in_XMM1_Bi;
        auVar22[6] = in_XMM1_Bj;
        auVar22[7] = in_XMM1_Bk;
        auVar22[8] = in_XMM1_Bl;
        auVar22[9] = in_XMM1_Bm;
        auVar22[10] = in_XMM1_Bn;
        auVar22[0xb] = in_XMM1_Bo;
        auVar22[0xc] = in_XMM1_Bp;
        auVar20[1] = in_XMM1_Bf;
        auVar20[0] = in_XMM1_Be;
        auVar20[2] = in_XMM1_Bg;
        auVar20[3] = in_XMM1_Bh;
        auVar20[4] = in_XMM1_Bi;
        auVar20[5] = in_XMM1_Bj;
        auVar20[6] = in_XMM1_Bk;
        auVar20[7] = in_XMM1_Bl;
        auVar20[8] = in_XMM1_Bm;
        auVar20[9] = in_XMM1_Bn;
        auVar20[10] = in_XMM1_Bo;
        auVar20[0xb] = in_XMM1_Bp;
        auVar18[1] = in_XMM1_Bg;
        auVar18[0] = in_XMM1_Bf;
        auVar18[2] = in_XMM1_Bh;
        auVar18[3] = in_XMM1_Bi;
        auVar18[4] = in_XMM1_Bj;
        auVar18[5] = in_XMM1_Bk;
        auVar18[6] = in_XMM1_Bl;
        auVar18[7] = in_XMM1_Bm;
        auVar18[8] = in_XMM1_Bn;
        auVar18[9] = in_XMM1_Bo;
        auVar18[10] = in_XMM1_Bp;
        uVar26 = (ushort)((ushort)(SUB161(auVar11 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB141(auVar24 >> 7,0) & 1) << 2 |
                          (ushort)(SUB131(auVar22 >> 7,0) & 1) << 3 |
                          (ushort)(SUB121(auVar20 >> 7,0) & 1) << 4 |
                          (ushort)(SUB111(auVar18 >> 7,0) & 1) << 5 |
                          (ushort)((byte)(CONCAT19(in_XMM1_Bp,
                                                   CONCAT18(in_XMM1_Bo,
                                                            CONCAT17(in_XMM1_Bn,
                                                                     CONCAT16(in_XMM1_Bm,
                                                                              CONCAT15(in_XMM1_Bl,
                                                                                       CONCAT14(
                                                  in_XMM1_Bk,
                                                  CONCAT13(in_XMM1_Bj,
                                                           CONCAT12(in_XMM1_Bi,
                                                                    CONCAT11(in_XMM1_Bh,in_XMM1_Bg))
                                                          ))))))) >> 7) & 1) << 6 |
                          (ushort)((byte)(CONCAT18(in_XMM1_Bp,
                                                   CONCAT17(in_XMM1_Bo,
                                                            CONCAT16(in_XMM1_Bn,
                                                                     CONCAT15(in_XMM1_Bm,
                                                                              CONCAT14(in_XMM1_Bl,
                                                                                       CONCAT13(
                                                  in_XMM1_Bk,
                                                  CONCAT12(in_XMM1_Bj,
                                                           CONCAT11(in_XMM1_Bi,in_XMM1_Bh)))))))) >>
                                         7) & 1) << 7 | (ushort)(in_XMM1_Bp >> 7) << 0xf) + 1;
        uVar7 = 0;
        if (uVar26 != 0) {
          for (; (uVar26 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
          }
        }
        __s = __s + uVar7;
        cVar3 = pcVar27[uVar7];
        pcVar27 = pcVar27 + uVar7;
      }
    } while (pcVar27 != pcVar4 + sVar5);
  }
  this->size_ = local_40->size_;
  (this->settings_).
  super_CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
  .
  super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>,_0UL,_false>
  .value = (this->settings_).
           super_CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
           .
           super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>,_0UL,_false>
           .value - local_40->size_;
  return;
}

Assistant:

raw_hash_set(const raw_hash_set& that, const allocator_type& a)
				: raw_hash_set(0, that.hash_ref(), that.eq_ref(), a)
			{
				rehash(that.capacity());   // operator=() should preserve load_factor
				// Because the table is guaranteed to be empty, we can do something faster
				// than a full `insert`.
				for (const auto& v : that) {
					const size_t hashval = PolicyTraits::apply(HashElement{hash_ref()}, v);
					auto target = find_first_non_full(hashval);
					set_ctrl(target.offset, H2(hashval));
					emplace_at(target.offset, v);
					infoz_.RecordInsert(hashval, target.probe_length);
				}
				size_ = that.size();
				growth_left() -= that.size();
			}